

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O0

rand_gen * init_rand(char *gen_type)

{
  int iVar1;
  param_1 *ppVar2;
  param_3 *ppVar3;
  param_2 *ppVar4;
  char local_c8 [8];
  char hostname [64];
  char type_2 [27];
  char type_1 [24];
  char local_48 [8];
  char type [29];
  rand_gen *gen;
  char *gen_type_local;
  
  gen_type_local = (char *)malloc(0x34);
  if ((rand_gen *)gen_type_local != (rand_gen *)0x0) {
    iVar1 = strncmp(gen_type,"fixed",5);
    if (iVar1 == 0) {
      ppVar2 = parse_param_1(gen_type);
      fixed_init((rand_gen *)gen_type_local,ppVar2);
    }
    else {
      iVar1 = strncmp(gen_type,"rr",2);
      if (iVar1 == 0) {
        ppVar2 = parse_param_1(gen_type);
        rr_init((rand_gen *)gen_type_local,ppVar2);
      }
      else {
        iVar1 = strncmp(gen_type,"uni",3);
        if (iVar1 == 0) {
          ppVar2 = parse_param_1(gen_type);
          uni_init((rand_gen *)gen_type_local,ppVar2);
        }
        else {
          iVar1 = strncmp(gen_type,"exp",3);
          if (iVar1 == 0) {
            ppVar2 = parse_param_1(gen_type);
            exp_init((rand_gen *)gen_type_local,ppVar2);
          }
          else {
            iVar1 = strncmp(gen_type,"pareto",6);
            if (iVar1 == 0) {
              ppVar3 = parse_param_3(gen_type);
              gpar_init((rand_gen *)gen_type_local,ppVar3);
            }
            else {
              iVar1 = strncmp(gen_type,"gev",3);
              if (iVar1 == 0) {
                ppVar3 = parse_param_3(gen_type);
                gev_init((rand_gen *)gen_type_local,ppVar3);
              }
              else {
                iVar1 = strcmp(gen_type,"fb_key");
                if (iVar1 == 0) {
                  builtin_strncpy(local_48,"gev:30.7",8);
                  builtin_strncpy(type,"984:8.20449:0.078688",0x15);
                  ppVar3 = parse_param_3(local_48);
                  gev_init((rand_gen *)gen_type_local,ppVar3);
                }
                else {
                  iVar1 = strcmp(gen_type,"fb_ia");
                  if (iVar1 == 0) {
                    stack0xffffffffffffff98 = 0x313a303a72617067;
                    ppVar3 = parse_param_3(type_2 + 0x18);
                    gpar_init((rand_gen *)gen_type_local,ppVar3);
                  }
                  else {
                    iVar1 = strcmp(gen_type,"fb_val");
                    if (iVar1 == 0) {
                      builtin_strncpy(hostname + 0x38,"gpar:15.",8);
                      builtin_strncpy(type_2,"0:214.476:0.348238",0x13);
                      ppVar3 = parse_param_3(hostname + 0x38);
                      gpar_init((rand_gen *)gen_type_local,ppVar3);
                    }
                    else {
                      iVar1 = strncmp(gen_type,"bimodal",7);
                      if (iVar1 == 0) {
                        ppVar3 = parse_param_3(gen_type);
                        bimodal_init((rand_gen *)gen_type_local,ppVar3);
                      }
                      else {
                        iVar1 = strncmp(gen_type,"lognorm",7);
                        if (iVar1 == 0) {
                          ppVar4 = parse_param_2(gen_type);
                          lognormal_init((rand_gen *)gen_type_local,ppVar4);
                        }
                        else {
                          iVar1 = strncmp(gen_type,"gamma",5);
                          if (iVar1 == 0) {
                            ppVar4 = parse_param_2(gen_type);
                            gamma_init((rand_gen *)gen_type_local,ppVar4);
                          }
                          else {
                            gethostname(local_c8,0x40);
                            fprintf(_stderr,"[%s] ",local_c8);
                            fprintf(_stderr,"Unknown generator type %s\n",gen_type);
                            gen_type_local = (char *)0x0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    return (rand_gen *)gen_type_local;
  }
  __assert_fail("gen",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                ,0x150,"struct rand_gen *init_rand(char *)");
}

Assistant:

struct rand_gen *init_rand(char *gen_type)
{
	struct rand_gen *gen = (struct rand_gen *)malloc(sizeof(struct rand_gen));
	assert(gen);

	if (strncmp(gen_type, "fixed", 5) == 0)
		fixed_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "rr", 2) == 0)
		rr_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "uni", 3) == 0)
		uni_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "exp", 3) == 0)
		exp_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "pareto", 6) == 0)
		gpar_init(gen, parse_param_3(gen_type));
	else if (strncmp(gen_type, "gev", 3) == 0)
		gev_init(gen, parse_param_3(gen_type));
	else if (strcmp(gen_type, "fb_key") == 0) {
		char type[] = "gev:30.7984:8.20449:0.078688";
		gev_init(gen, parse_param_3(type));
	} else if (strcmp(gen_type, "fb_ia") == 0) {
		char type[] = "gpar:0:16.0292:0.154971";
		gpar_init(gen, parse_param_3(type));
	} else if (strcmp(gen_type, "fb_val") == 0) {
		/* WARNING: this is not exactly the same as mutilate */
		char type[] = "gpar:15.0:214.476:0.348238";
		gpar_init(gen, parse_param_3(type));
	} else if (strncmp(gen_type, "bimodal", 7) == 0)
		bimodal_init(gen, parse_param_3(gen_type));
	else if (strncmp(gen_type, "lognorm", 7) == 0)
		lognormal_init(gen, parse_param_2(gen_type));
	else if (strncmp(gen_type, "gamma", 5) == 0)
		gamma_init(gen, parse_param_2(gen_type));
	else {
		lancet_fprintf(stderr, "Unknown generator type %s\n", gen_type);
		return NULL;
	}
	return gen;
}